

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O0

int mbedtls_sha1_update(mbedtls_sha1_context *ctx,uchar *input,size_t ilen)

{
  int iVar1;
  ulong __n;
  ulong in_RDX;
  void *in_RSI;
  uint *in_RDI;
  uint32_t left;
  size_t fill;
  int ret;
  uint local_34;
  ulong local_20;
  void *local_18;
  
  if (in_RDX != 0) {
    local_34 = *in_RDI & 0x3f;
    __n = (ulong)(0x40 - local_34);
    *in_RDI = (uint)in_RDX + *in_RDI;
    *in_RDI = *in_RDI;
    if (*in_RDI < (uint)in_RDX) {
      in_RDI[1] = in_RDI[1] + 1;
    }
    local_20 = in_RDX;
    local_18 = in_RSI;
    if ((local_34 != 0) && (__n <= in_RDX)) {
      memcpy((void *)((long)in_RDI + (ulong)local_34 + 0x1c),in_RSI,__n);
      iVar1 = mbedtls_internal_sha1_process((mbedtls_sha1_context *)input,(uchar *)ilen);
      if (iVar1 != 0) {
        return iVar1;
      }
      local_18 = (void *)(__n + (long)in_RSI);
      local_20 = in_RDX - __n;
      local_34 = 0;
    }
    for (; 0x3f < local_20; local_20 = local_20 - 0x40) {
      iVar1 = mbedtls_internal_sha1_process((mbedtls_sha1_context *)input,(uchar *)ilen);
      if (iVar1 != 0) {
        return iVar1;
      }
      local_18 = (void *)((long)local_18 + 0x40);
    }
    if (local_20 != 0) {
      memcpy((void *)((long)in_RDI + (ulong)local_34 + 0x1c),local_18,local_20);
    }
  }
  return 0;
}

Assistant:

int mbedtls_sha1_update(mbedtls_sha1_context *ctx,
                        const unsigned char *input,
                        size_t ilen)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t fill;
    uint32_t left;

    if (ilen == 0) {
        return 0;
    }

    left = ctx->total[0] & 0x3F;
    fill = 64 - left;

    ctx->total[0] += (uint32_t) ilen;
    ctx->total[0] &= 0xFFFFFFFF;

    if (ctx->total[0] < (uint32_t) ilen) {
        ctx->total[1]++;
    }

    if (left && ilen >= fill) {
        memcpy((void *) (ctx->buffer + left), input, fill);

        if ((ret = mbedtls_internal_sha1_process(ctx, ctx->buffer)) != 0) {
            return ret;
        }

        input += fill;
        ilen  -= fill;
        left = 0;
    }

    while (ilen >= 64) {
        if ((ret = mbedtls_internal_sha1_process(ctx, input)) != 0) {
            return ret;
        }

        input += 64;
        ilen  -= 64;
    }

    if (ilen > 0) {
        memcpy((void *) (ctx->buffer + left), input, ilen);
    }

    return 0;
}